

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O3

int sais_main(void *T,int *SA,int *LCP,int fs,int n,int k,int cs,int isbwt,int level0)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  int i;
  uint *__s;
  uint *__ptr;
  ulong uVar7;
  void *__s_00;
  int *piVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  int *piVar16;
  void *pvVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint *puVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong local_e0;
  uint local_84;
  int t;
  void *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  size_t local_40;
  ulong local_38;
  
  uVar7 = (ulong)(uint)n;
  if (T == (void *)0x0) {
    __assert_fail("(T != NULL) && (SA != NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x236,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (((fs < 0) || (n < 1)) || (k < 1)) {
    __assert_fail("(0 <= fs) && (0 < n) && (1 <= k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x237,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if ((uint)k < 0x101) {
    __s = (uint *)malloc((ulong)(uint)(k * 4));
    if (__s == (uint *)0x0) {
      return -2;
    }
    if ((uint)k <= (uint)fs) {
      __ptr = (uint *)(SA + ((n + fs) - k));
      bVar24 = 1;
LAB_0010e992:
      bVar3 = false;
      goto LAB_0010e9c2;
    }
    __ptr = (uint *)malloc((ulong)(uint)(k * 4));
    if (__ptr != (uint *)0x0) {
      bVar24 = 3;
      goto LAB_0010e992;
    }
LAB_00111015:
    iVar23 = -2;
    goto LAB_001105d7;
  }
  if ((uint)fs < (uint)k) {
    __ptr = (uint *)malloc((ulong)(uint)k << 2);
    if (__ptr == (uint *)0x0) {
      return -2;
    }
    bVar24 = 0xc;
    __s = __ptr;
LAB_0010e90c:
    bVar3 = false;
  }
  else {
    __s = (uint *)(SA + ((n + fs) - k));
    if (fs - k < k) {
      if ((uint)k < 0x401) {
        __ptr = (uint *)malloc((ulong)(uint)(k * 4));
        if (__ptr == (uint *)0x0) {
          return -2;
        }
        bVar24 = 2;
        goto LAB_0010e90c;
      }
      bVar24 = 8;
      bVar3 = false;
      __ptr = __s;
    }
    else {
      __ptr = __s + -(ulong)(uint)k;
      bVar24 = 0;
      bVar3 = true;
    }
  }
LAB_0010e9c2:
  if (((uint)n < 0x40000000) && (1 < (uint)n / (uint)k)) {
    if ((bVar24 & 1) == 0) {
      if (bVar3) {
        bVar24 = (k * 2 <= fs + k * -2) << 5;
      }
    }
    else {
      bVar24 = bVar24 + (k * 2 <= fs - k) * '\x10' + 0x10;
    }
  }
  uVar4 = (ulong)(uint)k;
  sVar1 = uVar4 * 4;
  uVar19 = 0;
  local_58 = (ulong)(uint)fs;
  memset(__s,0,sVar1);
  uVar5 = (ulong)(uint)n;
  do {
    if (cs == 4) {
      uVar11 = *(uint *)((long)T + uVar19 * 4);
    }
    else {
      uVar11 = (uint)*(byte *)((long)T + uVar19);
    }
    __s[(int)uVar11] = __s[(int)uVar11] + 1;
    uVar19 = uVar19 + 1;
  } while (uVar5 != uVar19);
  uVar19 = 0;
  uVar11 = 0;
  do {
    uVar11 = uVar11 + __s[uVar19];
    __ptr[uVar19] = uVar11;
    uVar19 = uVar19 + 1;
  } while (uVar4 != uVar19);
  memset(SA,0,uVar5 * 4);
  uVar11 = n - 1;
  uVar22 = (ulong)uVar11;
  uVar34 = uVar22;
  uVar19 = uVar22;
  if (cs == 4) {
    uVar33 = *(uint *)((long)T + uVar22 * 4);
  }
  else {
    uVar33 = (uint)*(byte *)((long)T + uVar22);
  }
  do {
    if ((int)uVar34 < 1) {
      bVar3 = false;
      local_e0._0_4_ = 0;
      goto LAB_0010ebbe;
    }
    uVar26 = uVar19 - 1 & 0xffffffff;
    if (cs == 4) {
      uVar28 = *(uint *)((long)T + uVar26 * 4);
    }
    else {
      uVar28 = (uint)*(byte *)((long)T + uVar26);
    }
    uVar34 = (ulong)((int)uVar34 - 1);
    bVar3 = (int)uVar33 <= (int)uVar28;
    uVar19 = uVar19 - 1;
    uVar33 = uVar28;
  } while (bVar3);
  piVar8 = &t;
  local_e0 = 0;
  uVar19 = uVar7;
  do {
    uVar33 = (uint)uVar34;
    uVar26 = uVar34;
    do {
      uVar12 = uVar28;
      uVar33 = uVar33 - 1;
      uVar20 = uVar26 - 1;
      uVar21 = uVar19 & 0xffffffff;
      if (uVar26 == 0) goto LAB_0010ec5c;
      uVar34 = (ulong)uVar33;
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + uVar20 * 4);
      }
      else {
        uVar28 = (uint)*(byte *)((long)T + (uVar26 - 1));
      }
      uVar26 = uVar20;
    } while ((int)uVar28 <= (int)uVar12);
    *piVar8 = (int)uVar19;
    uVar32 = __ptr[(int)uVar12];
    __ptr[(int)uVar12] = uVar32 - 1;
    piVar8 = SA + (long)(int)uVar32 + -1;
    local_e0 = (ulong)((int)local_e0 + 1);
    uVar19 = (ulong)uVar33;
    uVar33 = uVar28;
    do {
      uVar19 = uVar19 - 1;
      uVar21 = uVar20;
      if ((int)uVar34 < 1) goto LAB_0010ec5c;
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + (uVar19 & 0xffffffff) * 4);
      }
      else {
        uVar28 = (uint)*(byte *)((long)T + (uVar19 & 0xffffffff));
      }
      uVar12 = (int)uVar34 - 1;
      uVar34 = (ulong)uVar12;
      bVar3 = (int)uVar33 <= (int)uVar28;
      uVar33 = uVar28;
    } while (bVar3);
    uVar19 = uVar20;
  } while (-1 < (int)uVar12);
LAB_0010ec5c:
  uVar33 = (uint)local_e0;
  bVar3 = 1 < (int)uVar33;
  if ((int)uVar33 < 2) {
    bVar3 = false;
    iVar23 = 0;
    if (uVar33 == 1) {
      *piVar8 = (int)uVar21 + 1;
      if (level0 != 0) {
        *(undefined4 *)((long)LCP + ((long)piVar8 - (long)SA)) = 0xffffffff;
        local_e0 = 1;
        bVar3 = false;
        iVar23 = 1;
        goto LAB_001109e5;
      }
      local_e0._0_4_ = 1;
      bVar3 = false;
LAB_0010ebbe:
      if ((bVar24 & 8) != 0) {
        uVar19 = 0;
        memset(__s,0,sVar1);
        do {
          if (cs == 4) {
            uVar33 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            uVar33 = (uint)*(byte *)((long)T + uVar19);
          }
          __s[(int)uVar33] = __s[(int)uVar33] + 1;
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      if (bVar3) {
        uVar19 = 0;
        uVar33 = 0;
        do {
          uVar33 = uVar33 + __s[uVar19];
          __ptr[uVar19] = uVar33;
          uVar19 = uVar19 + 1;
        } while (uVar4 != uVar19);
        uVar19 = (ulong)((int)local_e0 - 1);
        iVar23 = SA[uVar19];
        if (cs == 4) {
          uVar33 = *(uint *)((long)T + (long)iVar23 * 4);
        }
        else {
          uVar33 = (uint)*(byte *)((long)T + (long)iVar23);
        }
        if (level0 == 0) {
          while( true ) {
            uVar28 = __ptr[(int)uVar33];
            iVar15 = (int)uVar7;
            if ((int)uVar28 < iVar15) {
              lVar37 = (long)iVar15;
              memset(SA + (lVar37 - (ulong)(~uVar28 + iVar15)) + -1,0,
                     (ulong)(~uVar28 + iVar15) * 4 + 4);
              do {
                lVar37 = lVar37 + -1;
              } while ((int)uVar28 < lVar37);
              iVar15 = (int)lVar37;
            }
            uVar28 = iVar15 - 1;
            SA[(int)uVar28] = iVar23;
            iVar39 = (int)uVar19;
            if (iVar39 < 1) break;
            piVar8 = SA + (long)iVar15 + -2;
            uVar19 = (ulong)(iVar39 - 1);
            uVar12 = uVar28;
            while( true ) {
              uVar7 = (ulong)uVar12;
              iVar23 = SA[uVar19];
              if (cs == 4) {
                uVar32 = *(uint *)((long)T + (long)iVar23 * 4);
              }
              else {
                uVar32 = (uint)*(byte *)((long)T + (long)iVar23);
              }
              if (uVar32 != uVar33) break;
              *piVar8 = iVar23;
              uVar12 = uVar12 - 1;
              piVar8 = piVar8 + -1;
              bVar3 = (long)uVar19 < 1;
              uVar19 = uVar19 - 1;
              if (bVar3) {
                uVar28 = uVar28 - iVar39;
                goto LAB_0010ef28;
              }
            }
            uVar19 = uVar19 & 0xffffffff;
            uVar33 = uVar32;
          }
LAB_0010ef28:
          if (0 < (int)uVar28) {
            memset(SA,0,(ulong)uVar28 << 2);
          }
        }
        else {
          iVar15 = LCP[uVar19];
          while( true ) {
            uVar28 = __ptr[(int)uVar33];
            if ((int)uVar28 < (int)uVar7) {
              uVar7 = (ulong)(int)uVar7;
              do {
                SA[uVar7 - 1] = 0;
                LCP[uVar7 - 1] = -2;
                uVar7 = uVar7 - 1;
              } while ((long)(int)uVar28 < (long)uVar7);
            }
            uVar28 = (int)uVar7 - 1;
            lVar37 = (long)(int)uVar28;
            SA[lVar37] = iVar23;
            LCP[lVar37] = iVar15;
            iVar39 = (int)uVar19;
            if (iVar39 < 1) break;
            uVar7 = (ulong)(iVar39 - 1U);
            lVar10 = 0;
            while( true ) {
              iVar23 = SA[uVar7 + lVar10];
              if (cs == 4) {
                uVar12 = *(uint *)((long)T + (long)iVar23 * 4);
              }
              else {
                uVar12 = (uint)*(byte *)((long)T + (long)iVar23);
              }
              iVar15 = LCP[uVar7 + lVar10];
              if (uVar12 != uVar33) break;
              SA[lVar37 + lVar10 + -1] = iVar23;
              LCP[lVar37 + lVar10 + -1] = iVar15;
              lVar25 = uVar7 + lVar10;
              lVar10 = lVar10 + -1;
              if (lVar25 < 1) {
                lVar37 = (long)(int)uVar28;
                uVar28 = uVar28 - iVar39;
                lVar37 = lVar37 + lVar10;
                goto LAB_0010ee10;
              }
            }
            uVar7 = (ulong)(uVar28 + (int)lVar10);
            LCP[lVar37 + lVar10] = -1;
            uVar19 = (ulong)((iVar39 - 1U) + (int)lVar10);
            uVar33 = uVar12;
          }
LAB_0010ee10:
          LCP[lVar37] = -1;
          if (0 < (int)uVar28) {
            uVar7 = (ulong)uVar28 + 1;
            do {
              SA[uVar7 - 2] = 0;
              LCP[uVar7 - 2] = -2;
              uVar7 = uVar7 - 1;
            } while (1 < uVar7);
          }
        }
      }
      if (isbwt == 0) {
        if (level0 == 0) {
          if (__s == __ptr) {
            uVar7 = 0;
            memset(__s,0,sVar1);
            do {
              if (cs == 4) {
                uVar33 = *(uint *)((long)T + uVar7 * 4);
              }
              else {
                uVar33 = (uint)*(byte *)((long)T + uVar7);
              }
              __s[(int)uVar33] = __s[(int)uVar33] + 1;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          uVar7 = 0;
          uVar33 = 0;
          do {
            uVar28 = __s[uVar7];
            __ptr[uVar7] = uVar33;
            uVar7 = uVar7 + 1;
            uVar33 = uVar28 + uVar33;
          } while (uVar4 != uVar7);
          if (cs == 4) {
            uVar7 = (ulong)*(int *)((long)T + uVar22 * 4);
            uVar33 = __ptr[uVar7];
            if (1 < n) {
              uVar28 = *(uint *)((long)T + uVar5 * 4 + -8);
LAB_0011040b:
              if ((int)uVar28 < (int)uVar7) {
                uVar11 = -n;
              }
            }
          }
          else {
            uVar7 = (ulong)*(byte *)((long)T + uVar22);
            uVar33 = __ptr[uVar7];
            if (1 < n) {
              uVar28 = (uint)*(byte *)((long)T + (uVar5 - 2));
              goto LAB_0011040b;
            }
          }
          SA[(int)uVar33] = uVar11;
          uVar33 = uVar33 + 1;
          uVar19 = 0;
          do {
            uVar11 = SA[uVar19];
            lVar37 = (long)(int)uVar11;
            SA[uVar19] = ~uVar11;
            if (0 < lVar37) {
              uVar28 = uVar11 - 1;
              if (cs == 4) {
                uVar12 = *(uint *)((long)T + (ulong)uVar28 * 4);
                if ((int)uVar12 < *(int *)((long)T + lVar37 * 4)) {
LAB_00111236:
                  __assert_fail("chr(j) >= chr(j + 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                ,0x116,
                                "void induceSA(const void *, int *, int *, int *, int, int, int)");
                }
              }
              else {
                bVar2 = *(byte *)((long)T + (ulong)uVar28);
                uVar12 = (uint)bVar2;
                if (bVar2 < *(byte *)((long)T + lVar37)) goto LAB_00111236;
              }
              uVar32 = (uint)uVar7;
              if (uVar12 != uVar32) {
                __ptr[(int)uVar32] = uVar33;
                uVar33 = __ptr[(int)uVar12];
                uVar32 = uVar12;
              }
              if ((long)(int)uVar33 <= (long)uVar19) {
                __assert_fail("i < bb",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x118,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              uVar12 = 0;
              if (uVar11 != 1) {
                if (cs == 4) {
                  uVar35 = *(uint *)((long)T + lVar37 * 4 + -8);
                }
                else {
                  uVar35 = (uint)*(byte *)((long)T + lVar37 + -2);
                }
                uVar12 = -uVar11;
                if ((int)uVar32 <= (int)uVar35) {
                  uVar12 = uVar28;
                }
              }
              SA[(int)uVar33] = uVar12;
              uVar33 = uVar33 + 1;
              uVar7 = (ulong)uVar32;
            }
            uVar19 = uVar19 + 1;
          } while (uVar5 != uVar19);
          if (__s == __ptr) {
            uVar7 = 0;
            memset(__s,0,sVar1);
            do {
              if (cs == 4) {
                uVar11 = *(uint *)((long)T + uVar7 * 4);
              }
              else {
                uVar11 = (uint)*(byte *)((long)T + uVar7);
              }
              __s[(int)uVar11] = __s[(int)uVar11] + 1;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          uVar7 = 0;
          uVar11 = 0;
          do {
            uVar11 = uVar11 + __s[uVar7];
            __ptr[uVar7] = uVar11;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
          uVar11 = *__ptr;
          uVar33 = 0;
          do {
            uVar28 = SA[uVar22];
            lVar37 = (long)(int)uVar28;
            if (lVar37 < 1) {
              SA[uVar22] = ~uVar28;
            }
            else {
              uVar12 = uVar28 - 1;
              if (cs == 4) {
                uVar32 = *(uint *)((long)T + (ulong)uVar12 * 4);
                if (*(int *)((long)T + lVar37 * 4) < (int)uVar32) {
LAB_00111274:
                  __assert_fail("chr(j) <= chr(j + 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                ,0x123,
                                "void induceSA(const void *, int *, int *, int *, int, int, int)");
                }
              }
              else {
                bVar2 = *(byte *)((long)T + (ulong)uVar12);
                uVar32 = (uint)bVar2;
                if (*(byte *)((long)T + lVar37) < bVar2) goto LAB_00111274;
              }
              if (uVar32 != uVar33) {
                __ptr[(int)uVar33] = uVar11;
                uVar11 = __ptr[(int)uVar32];
                uVar33 = uVar32;
              }
              lVar10 = (long)(int)uVar11;
              if ((long)uVar22 < lVar10) {
                __assert_fail("bb <= i",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x125,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              if (uVar12 == 0) {
LAB_00110595:
                uVar12 = -uVar28;
              }
              else {
                if (cs == 4) {
                  uVar32 = *(uint *)((long)T + lVar37 * 4 + -8);
                }
                else {
                  uVar32 = (uint)*(byte *)((long)T + lVar37 + -2);
                }
                if ((int)uVar33 < (int)uVar32) goto LAB_00110595;
              }
              uVar11 = uVar11 - 1;
              SA[lVar10 + -1] = uVar12;
            }
            bVar3 = 0 < (long)uVar22;
            uVar22 = uVar22 - 1;
          } while (bVar3);
          iVar23 = 0;
        }
        else {
          local_68 = malloc(sVar1);
          if ((local_68 == (void *)0x0) ||
             (pvVar17 = malloc(sVar1), auVar47 = _DAT_00112080, pvVar17 == (void *)0x0)) {
LAB_00111099:
            exit(-1);
          }
          lVar37 = uVar4 - 1;
          auVar41._8_4_ = (int)lVar37;
          auVar41._0_8_ = lVar37;
          auVar41._12_4_ = (int)((ulong)lVar37 >> 0x20);
          uVar7 = 0;
          auVar41 = auVar41 ^ _DAT_00112080;
          auVar46 = _DAT_00113c50;
          auVar43 = _DAT_00112070;
          do {
            auVar45 = auVar43 ^ auVar47;
            iVar23 = auVar41._4_4_;
            if ((bool)(~(auVar45._4_4_ == iVar23 && auVar41._0_4_ < auVar45._0_4_ ||
                        iVar23 < auVar45._4_4_) & 1)) {
              *(uint *)((long)pvVar17 + uVar7 * 4) = uVar11;
            }
            if ((auVar45._12_4_ != auVar41._12_4_ || auVar45._8_4_ <= auVar41._8_4_) &&
                auVar45._12_4_ <= auVar41._12_4_) {
              *(uint *)((long)pvVar17 + uVar7 * 4 + 4) = uVar11;
            }
            auVar45 = auVar46 ^ auVar47;
            iVar15 = auVar45._4_4_;
            if (iVar15 <= iVar23 && (iVar15 != iVar23 || auVar45._0_4_ <= auVar41._0_4_)) {
              *(uint *)((long)pvVar17 + uVar7 * 4 + 8) = uVar11;
              *(uint *)((long)pvVar17 + uVar7 * 4 + 0xc) = uVar11;
            }
            uVar7 = uVar7 + 4;
            lVar37 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + 4;
            auVar43._8_8_ = lVar37 + 4;
            lVar37 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 4;
            auVar46._8_8_ = lVar37 + 4;
          } while ((k + 3U & 0xfffffffc) != uVar7);
          if (__s == __ptr) {
            uVar7 = 0;
            memset(__s,0,sVar1);
            do {
              if (cs == 4) {
                uVar33 = *(uint *)((long)T + uVar7 * 4);
              }
              else {
                uVar33 = (uint)*(byte *)((long)T + uVar7);
              }
              __s[(int)uVar33] = __s[(int)uVar33] + 1;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          uVar7 = 0;
          uVar33 = 0;
          do {
            uVar28 = __s[uVar7];
            __ptr[uVar7] = uVar33;
            uVar7 = uVar7 + 1;
            uVar33 = uVar28 + uVar33;
          } while (uVar4 != uVar7);
          memcpy(local_68,__ptr,sVar1);
          if (cs == 4) {
            local_38 = (ulong)*(int *)((long)T + uVar22 * 4);
            local_84 = __ptr[local_38];
            lVar37 = (long)(int)local_84;
            LCP[lVar37] = 0;
            uVar33 = *(uint *)((long)T + uVar5 * 4 + -8);
          }
          else {
            local_38 = (ulong)*(byte *)((long)T + uVar22);
            local_84 = __ptr[local_38];
            lVar37 = (long)(int)local_84;
            LCP[lVar37] = 0;
            uVar33 = (uint)*(byte *)((long)T + (uVar5 - 2));
          }
          uVar28 = -n;
          if ((int)local_38 <= (int)uVar33) {
            uVar28 = uVar11;
          }
          SA[lVar37] = uVar28;
          *LCP = 0;
          pvVar27 = malloc(sVar1);
          if (pvVar27 == (void *)0x0) goto LAB_00111099;
          local_84 = local_84 + 1;
          uVar7 = 0;
          uVar19 = 0;
          do {
            *(int *)((long)pvVar27 + uVar7 * 4) = (int)uVar19;
            uVar33 = (uint)(0 < (int)__s[uVar7]) + (int)uVar19;
            uVar19 = (ulong)uVar33;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
          local_40 = uVar19 * 4;
          local_60 = uVar19;
          __s_00 = malloc(local_40);
          if (__s_00 == (void *)0x0) goto LAB_00111099;
          if (uVar33 != 0) {
            memset(__s_00,0xff,local_40);
          }
          local_48 = pvVar27;
          piVar8 = (int *)malloc((long)(int)(uVar33 * 2 + 0x80c) << 2);
          if (piVar8 == (int *)0x0) goto LAB_00111099;
          local_58 = CONCAT44(local_58._4_4_,uVar33 * 2 + 0x808);
          piVar8[0] = -1;
          piVar8[1] = -1;
          iVar23 = 1;
          uVar7 = 0;
          auVar47 = _DAT_00112080;
          local_50 = uVar19;
          do {
            __n = local_40;
            uVar33 = SA[uVar7];
            lVar37 = (long)(int)uVar33;
            SA[uVar7] = ~uVar33;
            iVar15 = LCP[uVar7];
            uVar18 = (undefined4)uVar7;
            if (lVar37 < 1) {
              if (iVar15 == -1) {
                __assert_fail("lcp != -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x195,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (-1 < iVar15) {
                lVar37 = (long)iVar23;
                iVar23 = iVar23 + 4;
                lVar10 = (lVar37 << 0x20) + 0x200000000;
                piVar16 = piVar8 + lVar37;
                do {
                  lVar10 = lVar10 + -0x200000000;
                  iVar23 = iVar23 + -2;
                  iVar39 = *piVar16;
                  piVar16 = piVar16 + -2;
                } while (iVar15 <= iVar39);
                *(undefined4 *)((long)piVar8 + (lVar10 >> 0x1e) + 4) = uVar18;
                piVar8[iVar23] = iVar15;
              }
            }
            else {
              if (iVar15 == -1) {
                if (cs == 4) {
                  uVar28 = *(uint *)((long)T + lVar37 * 4);
                }
                else {
                  uVar28 = (uint)*(byte *)((long)T + lVar37);
                }
                lVar10 = 0;
                do {
                  if (cs == 4) {
                    uVar12 = *(uint *)((long)T + lVar10 * 4 + lVar37 * 4);
                    uVar32 = *(uint *)((long)T +
                                      (long)(*(int *)((long)pvVar17 + (long)(int)uVar28 * 4) +
                                            (int)lVar10) * 4);
                  }
                  else {
                    uVar12 = (uint)*(byte *)((long)T + lVar10 + lVar37);
                    uVar32 = (uint)*(byte *)((long)T +
                                            (long)(*(int *)((long)pvVar17 + (long)(int)uVar28 * 4) +
                                                  (int)lVar10));
                  }
                  lVar10 = lVar10 + 1;
                } while (uVar12 == uVar32);
                iVar15 = (int)lVar10 + -1;
              }
              uVar28 = uVar33 - 1;
              if (cs == 4) {
                uVar12 = *(uint *)((long)T + (ulong)uVar28 * 4);
                if ((int)uVar12 < *(int *)((long)T + lVar37 * 4)) {
LAB_00111100:
                  __assert_fail("chr(j) >= chr(j + 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                ,0x17a,
                                "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                               );
                }
              }
              else {
                bVar2 = *(byte *)((long)T + (ulong)uVar28);
                uVar12 = (uint)bVar2;
                if (bVar2 < *(byte *)((long)T + lVar37)) goto LAB_00111100;
              }
              lVar10 = (long)(int)uVar12;
              if (uVar12 != (uint)local_38) {
                __ptr[(int)(uint)local_38] = local_84;
                local_84 = __ptr[lVar10];
                local_38 = (ulong)uVar12;
              }
              lVar25 = (long)(int)local_84;
              if (lVar25 <= (long)uVar7) {
                __assert_fail("i < bb",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x17f,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              *(uint *)((long)pvVar17 + lVar10 * 4) = uVar28;
              uVar32 = 0;
              if (uVar33 != 1) {
                if (cs == 4) {
                  uVar35 = *(uint *)((long)T + lVar37 * 4 + -8);
                }
                else {
                  uVar35 = (uint)*(byte *)((long)T + lVar37 + -2);
                }
                uVar32 = uVar28;
                if ((int)uVar35 < (int)uVar12) {
                  uVar32 = -uVar33;
                }
              }
              SA[lVar25] = uVar32;
              if (iVar15 < 0) {
                __assert_fail("lcp >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x184,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar13 = ((long)iVar23 << 0x20) + 0x200000000;
              iVar39 = iVar23 + -1;
              lVar37 = (long)iVar23 + 2;
              iVar23 = iVar23 + 4;
              do {
                iVar29 = iVar39;
                iVar23 = iVar23 + -2;
                lVar30 = lVar37 + -2;
                lVar13 = lVar13 + -0x200000000;
                lVar6 = lVar37 + -2;
                lVar37 = lVar30;
                iVar39 = iVar29 + -2;
              } while (iVar15 <= piVar8[lVar6]);
              *(undefined4 *)((long)piVar8 + (lVar13 >> 0x1e) + 4) = uVar18;
              piVar8[iVar23] = iVar15;
              if (lVar30 < 1) {
                __assert_fail("stack_end-3 >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x18a,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar37 = (long)*(int *)((long)local_48 + lVar10 * 4);
              piVar16 = piVar8 + iVar29;
              do {
                piVar14 = piVar16;
                piVar16 = piVar14 + -2;
              } while (*(int *)((long)__s_00 + lVar37 * 4) < *piVar14);
              iVar15 = 0;
              if (local_84 != *(uint *)((long)local_68 + lVar10 * 4)) {
                iVar15 = piVar14[3] + 1;
              }
              LCP[lVar25] = iVar15;
              *(undefined4 *)((long)__s_00 + lVar37 * 4) = uVar18;
              local_84 = local_84 + 1;
            }
            if ((int)local_58 < iVar23) {
              pvVar27 = malloc(local_40);
              if (pvVar27 == (void *)0x0) goto LAB_00111099;
              memcpy(pvVar27,__s_00,__n);
              qsort(pvVar27,local_60,4,int_cmp);
              if ((int)local_50 == 0) {
                iVar15 = 1;
              }
              else {
                iVar15 = 1;
                lVar37 = 2;
                uVar19 = 0;
                do {
                  iVar39 = *(int *)((long)pvVar27 + uVar19 * 4);
                  if (piVar8[(long)iVar15 + -1] <= iVar39) {
                    if (iVar23 <= (int)lVar37) {
LAB_0010f939:
                      if ((int)lVar37 <= iVar23) {
                        __assert_fail("l < stack_end",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                      ,0x1a8,
                                      "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                                     );
                      }
                      break;
                    }
                    lVar37 = (long)(int)lVar37;
                    lVar10 = lVar37 << 0x20;
                    while (piVar8[lVar37] <= iVar39) {
                      lVar37 = lVar37 + 2;
                      lVar10 = lVar10 + 0x200000000;
                      if (iVar23 <= lVar37) goto LAB_0010f939;
                    }
                    piVar8[(long)iVar15 + 1] = *(int *)((long)piVar8 + (lVar10 >> 0x1e));
                    piVar8[(long)iVar15 + 2] = *(int *)((long)piVar8 + (lVar10 >> 0x1e) + 4);
                    iVar15 = iVar15 + 2;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != local_60);
              }
              iVar23 = iVar15;
              free(pvVar27);
              auVar47 = _DAT_00112080;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar5);
          if (__s == __ptr) {
            uVar7 = 0;
            memset(__s,0,sVar1);
            auVar47 = _DAT_00112080;
            do {
              if (cs == 4) {
                uVar33 = *(uint *)((long)T + uVar7 * 4);
              }
              else {
                uVar33 = (uint)*(byte *)((long)T + uVar7);
              }
              __s[(int)uVar33] = __s[(int)uVar33] + 1;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          uVar7 = 0;
          uVar33 = 0;
          do {
            uVar33 = uVar33 + __s[uVar7];
            __ptr[uVar7] = uVar33;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
          if ((int)local_50 != 0) {
            lVar37 = local_60 - 1;
            auVar42._8_4_ = (int)lVar37;
            auVar42._0_8_ = lVar37;
            auVar42._12_4_ = (int)((ulong)lVar37 >> 0x20);
            uVar7 = 0;
            auVar42 = auVar42 ^ auVar47;
            auVar45 = _DAT_00113c50;
            auVar44 = _DAT_00112070;
            do {
              auVar46 = auVar44 ^ auVar47;
              iVar23 = auVar42._4_4_;
              if ((bool)(~(auVar46._4_4_ == iVar23 && auVar42._0_4_ < auVar46._0_4_ ||
                          iVar23 < auVar46._4_4_) & 1)) {
                *(uint *)((long)__s_00 + uVar7 * 4) = uVar11;
              }
              if ((auVar46._12_4_ != auVar42._12_4_ || auVar46._8_4_ <= auVar42._8_4_) &&
                  auVar46._12_4_ <= auVar42._12_4_) {
                *(uint *)((long)__s_00 + uVar7 * 4 + 4) = uVar11;
              }
              iVar15 = SUB164(auVar45 ^ auVar47,4);
              if (iVar15 <= iVar23 &&
                  (iVar15 != iVar23 || SUB164(auVar45 ^ auVar47,0) <= auVar42._0_4_)) {
                *(uint *)((long)__s_00 + uVar7 * 4 + 8) = uVar11;
                *(uint *)((long)__s_00 + uVar7 * 4 + 0xc) = uVar11;
              }
              uVar7 = uVar7 + 4;
              lVar37 = auVar44._8_8_;
              auVar44._0_8_ = auVar44._0_8_ + 4;
              auVar44._8_8_ = lVar37 + 4;
              lVar37 = auVar45._8_8_;
              auVar45._0_8_ = auVar45._0_8_ + 4;
              auVar45._8_8_ = lVar37 + 4;
            } while (((int)local_60 + 3U & 0xfffffffc) != uVar7);
          }
          *piVar8 = n;
          piVar8[1] = -1;
          uVar11 = *__ptr;
          iVar23 = 1;
          uVar33 = 0;
          do {
            sVar1 = local_40;
            iVar15 = LCP[uVar22];
            if ((iVar15 < 0 && uVar22 != 0) && (-1 < LCP[uVar22 - 1])) {
              lVar37 = (long)(SA[uVar22] >> 0x1f ^ SA[uVar22]);
              lVar25 = (long)(SA[uVar22 - 1] >> 0x1f ^ SA[uVar22 - 1]);
              lVar10 = 0;
              do {
                if (cs == 4) {
                  uVar28 = *(uint *)((long)T + lVar10 * 4 + lVar37 * 4);
                  uVar12 = *(uint *)((long)T + lVar10 * 4 + lVar25 * 4);
                }
                else {
                  uVar28 = (uint)*(byte *)((long)T + lVar10 + lVar37);
                  uVar12 = (uint)*(byte *)((long)T + lVar10 + lVar25);
                }
                lVar10 = lVar10 + 1;
              } while (uVar28 == uVar12);
              iVar15 = (int)lVar10 + -1;
              LCP[uVar22] = iVar15;
            }
            uVar28 = SA[uVar22];
            lVar37 = (long)(int)uVar28;
            if (lVar37 < 1) {
              SA[uVar22] = ~uVar28;
            }
            else {
              uVar12 = uVar28 - 1;
              if (cs == 4) {
                uVar32 = *(uint *)((long)T + (ulong)uVar12 * 4);
                if (*(int *)((long)T + lVar37 * 4) < (int)uVar32) {
LAB_0011119b:
                  __assert_fail("chr(j) <= chr(j + 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                ,0x1c6,
                                "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                               );
                }
              }
              else {
                bVar2 = *(byte *)((long)T + (ulong)uVar12);
                uVar32 = (uint)bVar2;
                if (*(byte *)((long)T + lVar37) < bVar2) goto LAB_0011119b;
              }
              if (uVar32 != uVar33) {
                __ptr[(int)uVar33] = uVar11;
                uVar11 = __ptr[(int)uVar32];
                uVar33 = uVar32;
              }
              lVar10 = (long)(int)uVar11;
              if ((long)uVar22 < lVar10) {
                __assert_fail("bb <= i",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1ca,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (uVar12 == 0) {
LAB_0010fc30:
                uVar12 = -uVar28;
              }
              else {
                if (cs == 4) {
                  uVar35 = *(uint *)((long)T + lVar37 * 4 + -8);
                }
                else {
                  uVar35 = (uint)*(byte *)((long)T + lVar37 + -2);
                }
                if ((int)uVar32 < (int)uVar35) goto LAB_0010fc30;
              }
              SA[lVar10 + -1] = uVar12;
              if (k <= (int)(uVar32 + 1)) {
                __assert_fail("c0+1<k",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1cc,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (iVar23 < 1) {
                __assert_fail("stack_end-1 >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1d0,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar37 = (long)*(int *)((long)local_48 + (long)(int)uVar32 * 4);
              piVar16 = piVar8 + (iVar23 - 1);
              do {
                piVar14 = piVar16;
                piVar16 = piVar14 + -2;
              } while (*piVar14 <= *(int *)((long)__s_00 + lVar37 * 4));
              iVar39 = 0;
              if (uVar11 != *(uint *)((long)local_68 + (long)(int)(uVar32 + 1) * 4)) {
                iVar39 = piVar14[3] + 1;
              }
              LCP[lVar10] = iVar39;
              if (uVar22 == uVar11) {
                iVar15 = LCP[uVar22];
              }
              *(int *)((long)__s_00 + lVar37 * 4) = (int)uVar22;
              uVar11 = uVar11 - 1;
            }
            if (iVar15 < 0) {
              __assert_fail("lcp >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x1db,
                            "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
            lVar37 = (long)iVar23;
            lVar10 = (lVar37 << 0x20) + 0x200000000;
            iVar23 = iVar23 + 4;
            do {
              lVar10 = lVar10 + -0x200000000;
              iVar23 = iVar23 + -2;
              if (lVar37 < 0) break;
              piVar16 = piVar8 + lVar37;
              lVar37 = lVar37 + -2;
            } while (iVar15 <= *piVar16);
            *(int *)((long)piVar8 + (lVar10 >> 0x1e) + 4) = (int)uVar22;
            piVar8[iVar23] = iVar15;
            if ((int)local_58 < iVar23) {
              pvVar27 = malloc(local_40);
              if (pvVar27 == (void *)0x0) goto LAB_00111099;
              memcpy(pvVar27,__s_00,sVar1);
              uVar7 = local_60;
              qsort(pvVar27,local_60,4,int_cmp);
              if ((int)local_50 == 0) {
                iVar15 = 1;
              }
              else {
                iVar39 = 2;
                iVar15 = 1;
                do {
                  iVar29 = *(int *)((long)pvVar27 + uVar7 * 4 + -4);
                  if (iVar29 < piVar8[(long)iVar15 + -1]) {
                    if (iVar23 <= iVar39) {
LAB_0010fe0f:
                      if (iVar39 <= iVar23) {
                        __assert_fail("l < stack_end",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                      ,0x1ec,
                                      "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                                     );
                      }
                      break;
                    }
                    lVar37 = (long)iVar39 << 0x20;
                    lVar25 = (long)iVar39 + -2;
                    while (iVar29 < piVar8[lVar25 + 2]) {
                      lVar37 = lVar37 + 0x200000000;
                      iVar39 = iVar39 + 2;
                      lVar25 = lVar25 + 2;
                      if (lVar10 >> 0x20 <= lVar25) goto LAB_0010fe0f;
                    }
                    piVar8[(long)iVar15 + 1] = *(int *)((long)piVar8 + (lVar37 >> 0x1e));
                    piVar8[(long)iVar15 + 2] = *(int *)((long)piVar8 + (lVar37 >> 0x1e) + 4);
                    iVar15 = iVar15 + 2;
                  }
                  bVar3 = 1 < (long)uVar7;
                  uVar7 = uVar7 - 1;
                } while (bVar3);
              }
              iVar23 = iVar15;
              free(pvVar27);
            }
            bVar3 = 0 < (long)uVar22;
            uVar22 = uVar22 - 1;
          } while (bVar3);
          free(local_68);
          free(__s_00);
          free(piVar8);
          free(local_48);
          free(pvVar17);
          iVar23 = 0;
        }
      }
      else {
        if (__s == __ptr) {
          uVar7 = 0;
          memset(__s,0,sVar1);
          do {
            if (cs == 4) {
              uVar33 = *(uint *)((long)T + uVar7 * 4);
            }
            else {
              uVar33 = (uint)*(byte *)((long)T + uVar7);
            }
            __s[(int)uVar33] = __s[(int)uVar33] + 1;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        uVar7 = 0;
        uVar33 = 0;
        do {
          uVar28 = __s[uVar7];
          __ptr[uVar7] = uVar33;
          uVar7 = uVar7 + 1;
          uVar33 = uVar28 + uVar33;
        } while (uVar4 != uVar7);
        if (cs == 4) {
          uVar7 = (ulong)*(int *)((long)T + uVar22 * 4);
          puVar9 = (uint *)(SA + (int)__ptr[uVar7]);
          if (1 < n) {
            uVar33 = *(uint *)((long)T + uVar5 * 4 + -8);
            goto LAB_0010f208;
          }
LAB_0010f215:
          *puVar9 = uVar11;
        }
        else {
          uVar7 = (ulong)*(byte *)((long)T + uVar22);
          puVar9 = (uint *)(SA + (int)__ptr[uVar7]);
          if (n < 2) goto LAB_0010f215;
          uVar33 = (uint)*(byte *)((long)T + (uVar5 - 2));
LAB_0010f208:
          if ((int)uVar33 < (int)uVar7) {
            uVar11 = -n;
          }
          *puVar9 = uVar11;
        }
        puVar9 = puVar9 + 1;
        uVar19 = 0;
        do {
          uVar11 = SA[uVar19];
          lVar37 = (long)(int)uVar11;
          uVar33 = (uint)uVar7;
          if (lVar37 < 1) {
            if (uVar11 != 0) {
              SA[uVar19] = ~uVar11;
            }
          }
          else {
            uVar28 = uVar11 - 1;
            if (cs == 4) {
              uVar12 = *(uint *)((long)T + (ulong)uVar28 * 4);
              if ((int)uVar12 < *(int *)((long)T + lVar37 * 4)) {
LAB_0011101d:
                __assert_fail("chr(j) >= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x20d,
                              "int computeBWT(const void *, int *, int *, int *, int, int, int)");
              }
            }
            else {
              bVar2 = *(byte *)((long)T + (ulong)uVar28);
              uVar12 = (uint)bVar2;
              if (bVar2 < *(byte *)((long)T + lVar37)) goto LAB_0011101d;
            }
            SA[uVar19] = ~uVar12;
            if (uVar12 != uVar33) {
              __ptr[(int)uVar33] = (uint)((ulong)((long)puVar9 - (long)SA) >> 2);
              puVar9 = (uint *)(SA + (int)__ptr[(int)uVar12]);
              uVar33 = uVar12;
            }
            if ((long)puVar9 - (long)SA >> 2 <= (long)uVar19) {
              __assert_fail("i < (b - SA)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x210,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            uVar12 = 0;
            if (uVar11 != 1) {
              if (cs == 4) {
                uVar32 = *(uint *)((long)T + lVar37 * 4 + -8);
              }
              else {
                uVar32 = (uint)*(byte *)((long)T + lVar37 + -2);
              }
              uVar12 = -uVar11;
              if ((int)uVar33 <= (int)uVar32) {
                uVar12 = uVar28;
              }
            }
            *puVar9 = uVar12;
            puVar9 = puVar9 + 1;
          }
          uVar19 = uVar19 + 1;
          uVar7 = (ulong)uVar33;
        } while (uVar5 != uVar19);
        if (__s == __ptr) {
          uVar7 = 0;
          memset(__s,0,sVar1);
          do {
            if (cs == 4) {
              uVar11 = *(uint *)((long)T + uVar7 * 4);
            }
            else {
              uVar11 = (uint)*(byte *)((long)T + uVar7);
            }
            __s[(int)uVar11] = __s[(int)uVar11] + 1;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        uVar7 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 + __s[uVar7];
          __ptr[uVar7] = uVar11;
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        piVar8 = SA + (int)*__ptr;
        uVar7 = 0xffffffff;
        uVar11 = 0;
        do {
          uVar33 = SA[uVar22];
          lVar37 = (long)(int)uVar33;
          if (lVar37 < 1) {
            if (uVar33 == 0) {
              uVar7 = uVar22 & 0xffffffff;
            }
            else {
              SA[uVar22] = ~uVar33;
            }
          }
          else {
            uVar28 = uVar33 - 1;
            if (cs == 4) {
              uVar12 = *(uint *)((long)T + (ulong)uVar28 * 4);
              if (*(int *)((long)T + lVar37 * 4) < (int)uVar12) {
LAB_0011105b:
                __assert_fail("chr(j) <= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x21c,
                              "int computeBWT(const void *, int *, int *, int *, int, int, int)");
              }
            }
            else {
              bVar2 = *(byte *)((long)T + (ulong)uVar28);
              uVar12 = (uint)bVar2;
              if (*(byte *)((long)T + lVar37) < bVar2) goto LAB_0011105b;
            }
            SA[uVar22] = uVar12;
            if (uVar12 != uVar11) {
              __ptr[(int)uVar11] = (uint)((ulong)((long)piVar8 - (long)SA) >> 2);
              piVar8 = SA + (int)__ptr[(int)uVar12];
              uVar11 = uVar12;
            }
            if ((long)uVar22 < (long)piVar8 - (long)SA >> 2) {
              __assert_fail("(b - SA) <= i",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x21f,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            uVar12 = 0;
            if (uVar33 != 1) {
              if (cs == 4) {
                uVar33 = *(uint *)((long)T + lVar37 * 4 + -8);
              }
              else {
                uVar33 = (uint)*(byte *)((long)T + lVar37 + -2);
              }
              uVar12 = uVar28;
              if ((int)uVar11 < (int)uVar33) {
                uVar12 = ~uVar33;
              }
            }
            piVar8[-1] = uVar12;
            piVar8 = piVar8 + -1;
          }
          iVar23 = (int)uVar7;
          bVar3 = 0 < (long)uVar22;
          uVar22 = uVar22 - 1;
        } while (bVar3);
      }
      if ((bVar24 & 5) != 0) {
        free(__s);
      }
      goto LAB_001105cb;
    }
LAB_001109e5:
    if ((int)local_e0 <= iVar23) {
      if (level0 != 0) {
        if (bVar3) {
          uVar19 = 1;
          piVar8 = SA;
          do {
            iVar23 = *piVar8;
            piVar8 = SA + uVar19;
            lVar37 = 0;
            do {
              if (cs == 4) {
                uVar33 = *(uint *)((long)T + lVar37 * 4 + (long)*piVar8 * 4);
                uVar28 = *(uint *)((long)T + lVar37 * 4 + (long)iVar23 * 4);
              }
              else {
                uVar33 = (uint)*(byte *)((long)T + lVar37 + *piVar8);
                uVar28 = (uint)*(byte *)((long)T + lVar37 + iVar23);
              }
              lVar37 = lVar37 + 1;
            } while (uVar33 == uVar28);
            LCP[uVar19] = (int)lVar37 + -1;
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_e0);
        }
        else {
          bVar3 = false;
        }
      }
      goto LAB_0010ebbe;
    }
    if ((bVar24 & 4) != 0) {
      free(__s);
    }
    if ((bVar24 & 2) != 0) {
      free(__ptr);
    }
    iVar15 = (int)local_58 + n + (int)local_e0 * -2;
    if ((bVar24 & 0xd) == 0) {
      if (iVar15 < k + iVar23) {
        bVar24 = bVar24 | 8;
      }
      else {
        iVar15 = iVar15 - k;
      }
    }
    if (iVar15 + (int)local_e0 < (int)((uint)n >> 1)) {
      __assert_fail("(n >> 1) <= (newfs + m)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                    ,0x292,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)"
                   );
    }
    lVar37 = (long)(int)local_e0;
    piVar8 = SA + lVar37 + iVar15;
    iVar39 = (int)local_e0 + -1;
    if (1 < (uint)n) {
      lVar10 = (long)(int)(((uint)n >> 1) + (int)local_e0);
      iVar29 = iVar39;
      do {
        if (SA[lVar10 + -1] != 0) {
          lVar25 = (long)iVar29;
          iVar29 = iVar29 + -1;
          piVar8[lVar25] = SA[lVar10 + -1] + -1;
        }
        lVar10 = lVar10 + -1;
      } while (lVar37 < lVar10);
    }
    iVar23 = sais_main(piVar8,SA,(int *)0x0,iVar15,(int)local_e0,iVar23,4,0,0);
    if (iVar23 == 0) {
      uVar34 = uVar22;
      uVar19 = uVar22;
      if (cs == 4) {
        uVar33 = *(uint *)((long)T + uVar22 * 4);
      }
      else {
        uVar33 = (uint)*(byte *)((long)T + uVar22);
      }
      do {
        if ((int)uVar34 < 1) goto LAB_00110c69;
        uVar26 = uVar19 - 1 & 0xffffffff;
        if (cs == 4) {
          uVar28 = *(uint *)((long)T + uVar26 * 4);
        }
        else {
          uVar28 = (uint)*(byte *)((long)T + uVar26);
        }
        uVar34 = (ulong)((int)uVar34 - 1);
        bVar40 = (int)uVar33 <= (int)uVar28;
        uVar33 = uVar28;
        uVar19 = uVar19 - 1;
      } while (bVar40);
      do {
        uVar33 = (uint)uVar34;
        uVar19 = uVar34;
        do {
          uVar33 = uVar33 - 1;
          uVar34 = (ulong)uVar33;
          uVar26 = uVar19 - 1;
          if (uVar19 == 0) goto LAB_00110c69;
          if (cs == 4) {
            uVar12 = *(uint *)((long)T + uVar26 * 4);
          }
          else {
            uVar12 = (uint)*(byte *)((long)T + (uVar19 - 1));
          }
          bVar40 = (int)uVar12 <= (int)uVar28;
          uVar19 = uVar26;
          uVar28 = uVar12;
        } while (bVar40);
        lVar10 = (long)iVar39;
        iVar39 = iVar39 + -1;
        piVar8[lVar10] = (int)uVar26 + 1;
        uVar19 = uVar34;
        do {
          uVar19 = uVar19 - 1;
          if ((int)uVar34 < 1) goto LAB_00110c69;
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (uVar19 & 0xffffffff) * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + (uVar19 & 0xffffffff));
          }
          uVar33 = (int)uVar34 - 1;
          uVar34 = (ulong)uVar33;
          bVar40 = (int)uVar12 <= (int)uVar28;
          uVar12 = uVar28;
        } while (bVar40);
      } while (-1 < (int)uVar33);
LAB_00110c69:
      if (level0 == 0) {
LAB_00110f75:
        if (0 < (int)local_e0) {
          uVar19 = 0;
          do {
            SA[uVar19] = piVar8[SA[uVar19]];
            uVar19 = uVar19 + 1;
          } while (local_e0 != uVar19);
        }
      }
      else {
        piVar8[lVar37] = n;
        iVar23 = *SA;
        if ((int)local_e0 < (int)((uint)n / 3)) {
          LCP[lVar37 + iVar23 * 2] = uVar11;
          LCP[lVar37 + (iVar23 * 2 + 1)] = 0;
          if (bVar3) {
            uVar19 = 1;
            do {
              lVar10 = (long)iVar23;
              iVar23 = SA[uVar19];
              iVar15 = piVar8[lVar10];
              LCP[lVar37 + iVar23 * 2] = iVar15;
              LCP[lVar37 + (iVar23 * 2 + 1)] = piVar8[lVar10 + 1] - iVar15;
              uVar19 = uVar19 + 1;
            } while (local_e0 != uVar19);
          }
          uVar19 = 0;
          uVar33 = 0;
          iVar23 = 0;
          pvVar17 = T;
          pvVar27 = T;
          do {
            if (uVar19 == (uint)piVar8[iVar23]) {
              uVar28 = iVar23 * 2;
              if ((int)uVar33 < 1) {
                uVar33 = 0;
              }
              uVar34 = (ulong)uVar33;
              do {
                iVar15 = (int)uVar34;
                if (cs == 4) {
                  uVar33 = *(uint *)((long)pvVar27 + uVar34 * 4);
                  uVar12 = *(uint *)((long)T + (long)(LCP[lVar37 + (int)uVar28] + iVar15) * 4);
                }
                else {
                  uVar33 = (uint)*(byte *)((long)pvVar17 + uVar34);
                  uVar12 = (uint)*(byte *)((long)T + (long)(LCP[lVar37 + (int)uVar28] + iVar15));
                }
                uVar34 = uVar34 + 1;
              } while (uVar33 == uVar12);
              t = LCP[lVar37 + (int)(uVar28 | 1)];
              uVar33 = piVar8[(long)iVar23 + 1] - piVar8[iVar23];
              if ((int)uVar33 < t) {
                uVar33 = t;
              }
              LCP[lVar37 + (int)uVar28] = iVar15;
              uVar33 = ~uVar33 + (int)uVar34;
              iVar23 = iVar23 + 1;
            }
            uVar19 = uVar19 + 1;
            pvVar27 = (void *)((long)pvVar27 + 4);
            pvVar17 = (void *)((long)pvVar17 + 1);
          } while (uVar19 != uVar5);
          if (0 < (int)local_e0) {
            uVar19 = 0;
            do {
              LCP[uVar19] = LCP[lVar37 + SA[uVar19] * 2];
              uVar19 = uVar19 + 1;
            } while (local_e0 != uVar19);
            goto LAB_00110f75;
          }
        }
        else {
          LCP[iVar23] = uVar11;
          LCP[lVar37 + iVar23] = 0;
          if (bVar3) {
            uVar19 = 1;
            do {
              lVar10 = (long)iVar23;
              iVar23 = SA[uVar19];
              iVar15 = piVar8[lVar10];
              LCP[iVar23] = iVar15;
              LCP[lVar37 + iVar23] = piVar8[lVar10 + 1] - iVar15;
              uVar19 = uVar19 + 1;
            } while (local_e0 != uVar19);
          }
          uVar19 = 0;
          uVar33 = 0;
          iVar23 = 0;
          pvVar17 = T;
          pvVar27 = T;
          do {
            if (uVar19 == (uint)piVar8[iVar23]) {
              uVar34 = (ulong)uVar33;
              if ((int)uVar33 < 1) {
                uVar34 = 0;
              }
              do {
                iVar15 = (int)uVar34;
                if (cs == 4) {
                  uVar33 = *(uint *)((long)pvVar27 + uVar34 * 4);
                  uVar28 = *(uint *)((long)T + (long)(LCP[iVar23] + iVar15) * 4);
                }
                else {
                  uVar33 = (uint)*(byte *)((long)pvVar17 + uVar34);
                  uVar28 = (uint)*(byte *)((long)T + (long)(LCP[iVar23] + iVar15));
                }
                uVar34 = uVar34 + 1;
              } while (uVar33 == uVar28);
              t = LCP[lVar37 + iVar23];
              uVar33 = piVar8[(long)iVar23 + 1] - piVar8[iVar23];
              if ((int)uVar33 < t) {
                uVar33 = t;
              }
              LCP[lVar37 + iVar23] = iVar15;
              uVar33 = ~uVar33 + (int)uVar34;
              iVar23 = iVar23 + 1;
            }
            uVar19 = uVar19 + 1;
            pvVar27 = (void *)((long)pvVar27 + 4);
            pvVar17 = (void *)((long)pvVar17 + 1);
          } while (uVar19 != uVar5);
          if (0 < (int)local_e0) {
            uVar19 = 0;
            do {
              LCP[uVar19] = LCP[lVar37 + SA[uVar19]];
              uVar19 = uVar19 + 1;
            } while (local_e0 != uVar19);
            goto LAB_00110f75;
          }
        }
      }
      if (((bVar24 & 4) != 0) && (__ptr = (uint *)malloc(sVar1), __s = __ptr, __ptr == (uint *)0x0))
      {
        return -2;
      }
      if (((bVar24 & 2) != 0) && (__ptr = (uint *)malloc(sVar1), __ptr == (uint *)0x0)) {
        if ((bVar24 & 1) == 0) {
          return -2;
        }
        goto LAB_00111015;
      }
      goto LAB_0010ebbe;
    }
    iVar23 = -2;
    bVar24 = bVar24 & 1;
  }
  else {
    if ((bVar24 & 0x30) == 0) {
      if (__s == __ptr) {
        uVar19 = 0;
        memset(__s,0,sVar1);
        do {
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + uVar19);
          }
          __s[(int)uVar28] = __s[(int)uVar28] + 1;
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      uVar19 = 0;
      uVar28 = 0;
      do {
        uVar12 = __s[uVar19];
        __ptr[uVar19] = uVar28;
        uVar19 = uVar19 + 1;
        uVar28 = uVar12 + uVar28;
      } while (uVar4 != uVar19);
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + uVar22 * 4);
        uVar19 = (ulong)(int)uVar28;
        uVar12 = *(uint *)((long)T + (long)n * 4 + -8);
      }
      else {
        uVar19 = (ulong)*(byte *)((long)T + uVar22);
        uVar12 = (uint)*(byte *)((long)T + (long)n + -2);
        uVar28 = (uint)*(byte *)((long)T + uVar22);
      }
      iVar23 = 1 - n;
      if ((int)uVar28 <= (int)uVar12) {
        iVar23 = n + -2;
      }
      uVar12 = __ptr[uVar19];
      SA[(int)uVar12] = iVar23;
      uVar12 = uVar12 + 1;
      uVar19 = 0;
      do {
        uVar32 = SA[uVar19];
        lVar37 = (long)(int)uVar32;
        if (lVar37 < 1) {
          if ((int)uVar32 < 0) {
            uVar32 = ~uVar32;
            goto LAB_001106a0;
          }
        }
        else {
          if (cs == 4) {
            uVar35 = *(uint *)((long)T + lVar37 * 4);
            if ((int)uVar35 < *(int *)((long)T + lVar37 * 4 + 4)) {
LAB_001112f0:
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x5b,"void LMSsort1(const void *, int *, int *, int *, int, int, int)")
              ;
            }
          }
          else {
            uVar35 = (uint)*(byte *)((long)T + lVar37);
            if (*(byte *)((long)T + lVar37) < *(byte *)((long)T + lVar37 + 1)) goto LAB_001112f0;
          }
          if (uVar35 != uVar28) {
            __ptr[(int)uVar28] = uVar12;
            uVar12 = __ptr[(int)uVar35];
            uVar28 = uVar35;
          }
          if ((long)(int)uVar12 <= (long)uVar19) {
            __assert_fail("i < bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x5d,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          uVar35 = uVar32 - 1;
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + (ulong)uVar35 * 4);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + (ulong)uVar35);
          }
          uVar32 = -uVar32;
          if ((int)uVar28 <= (int)uVar36) {
            uVar32 = uVar35;
          }
          SA[(int)uVar12] = uVar32;
          uVar12 = uVar12 + 1;
          uVar32 = 0;
LAB_001106a0:
          SA[uVar19] = uVar32;
        }
        uVar19 = uVar19 + 1;
      } while (uVar5 != uVar19);
      if (__s == __ptr) {
        uVar19 = 0;
        memset(__s,0,sVar1);
        do {
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + uVar19);
          }
          __s[(int)uVar28] = __s[(int)uVar28] + 1;
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      uVar19 = 0;
      uVar28 = 0;
      do {
        uVar28 = uVar28 + __s[uVar19];
        __ptr[uVar19] = uVar28;
        uVar19 = uVar19 + 1;
      } while (uVar4 != uVar19);
      uVar28 = *__ptr;
      uVar12 = 0;
      uVar19 = uVar22;
      do {
        uVar32 = SA[uVar19];
        lVar37 = (long)(int)uVar32;
        if (0 < lVar37) {
          if (cs == 4) {
            uVar35 = *(uint *)((long)T + lVar37 * 4);
            if (*(int *)((long)T + lVar37 * 4 + 4) < (int)uVar35) {
LAB_0011132e:
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x6b,"void LMSsort1(const void *, int *, int *, int *, int, int, int)")
              ;
            }
          }
          else {
            uVar35 = (uint)*(byte *)((long)T + lVar37);
            if (*(byte *)((long)T + lVar37 + 1) < *(byte *)((long)T + lVar37)) goto LAB_0011132e;
          }
          if (uVar35 != uVar12) {
            __ptr[(int)uVar12] = uVar28;
            uVar28 = __ptr[(int)uVar35];
            uVar12 = uVar35;
          }
          lVar37 = (long)(int)uVar28;
          if ((long)uVar19 < lVar37) {
            __assert_fail("(bb) <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x6d,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          uVar35 = uVar32 - 1;
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + (ulong)uVar35 * 4);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + (ulong)uVar35);
          }
          uVar32 = ~uVar32;
          if ((int)uVar36 <= (int)uVar12) {
            uVar32 = uVar35;
          }
          uVar28 = uVar28 - 1;
          SA[lVar37 + -1] = uVar32;
          SA[uVar19] = 0;
        }
        bVar40 = 0 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar40);
      uVar19 = 1;
      while (SA[uVar19 - 1] < 0) {
        SA[uVar19 - 1] = ~SA[uVar19 - 1];
        bVar40 = uVar19 == uVar5;
        uVar19 = uVar19 + 1;
        if (bVar40) {
          __assert_fail("(i + 1) < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x7f,"int LMSpostproc1(const void *, int *, int, int, int)");
        }
      }
      uVar34 = uVar19 - 1;
      if ((int)uVar34 < (int)uVar33) {
        if ((int)uVar19 < n) {
          do {
            if (SA[uVar19] < 0) {
              iVar23 = (int)uVar34;
              uVar28 = iVar23 + 1;
              uVar34 = (ulong)uVar28;
              SA[iVar23] = ~SA[uVar19];
              SA[uVar19] = 0;
              if (uVar28 == uVar33) goto LAB_0011084c;
            }
            uVar19 = uVar19 + 1;
          } while (uVar5 != uVar19);
        }
        __assert_fail("i < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x82,"int LMSpostproc1(const void *, int *, int, int, int)");
      }
LAB_0011084c:
      uVar19 = uVar22;
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + uVar22 * 4);
      }
      else {
        uVar28 = (uint)*(byte *)((long)T + uVar22);
      }
      do {
        if ((int)uVar19 < 1) goto LAB_001108e3;
        uVar19 = uVar19 - 1;
        if (cs == 4) {
          uVar12 = *(uint *)((long)T + (uVar19 & 0xffffffff) * 4);
        }
        else {
          uVar12 = (uint)*(byte *)((long)T + (uVar19 & 0xffffffff));
        }
        bVar40 = (int)uVar28 <= (int)uVar12;
        uVar34 = uVar22;
        uVar28 = uVar12;
      } while (bVar40);
      do {
        uVar26 = uVar19 & 0xffffffff;
        do {
          uVar19 = uVar26 - 1;
          if (uVar26 == 0) goto LAB_001108e3;
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + (uVar26 - 1));
          }
          bVar40 = (int)uVar28 <= (int)uVar12;
          uVar26 = uVar19;
          uVar12 = uVar28;
        } while (bVar40);
        uVar32 = (int)uVar19 + 1;
        SA[(uVar32 >> 1) + uVar33] = (int)uVar34 - (int)uVar19;
        uVar19 = uVar19 & 0xffffffff;
        do {
          if ((int)uVar19 < 1) goto LAB_001108e3;
          uVar19 = uVar19 - 1;
          if (cs == 4) {
            uVar12 = *(uint *)((long)T + (uVar19 & 0xffffffff) * 4);
          }
          else {
            uVar12 = (uint)*(byte *)((long)T + (uVar19 & 0xffffffff));
          }
          bVar40 = (int)uVar28 <= (int)uVar12;
          uVar28 = uVar12;
        } while (bVar40);
        uVar34 = (ulong)uVar32;
      } while (-1 < (int)uVar19);
LAB_001108e3:
      uVar34 = 0;
      iVar23 = 0;
      uVar28 = 0;
      uVar19 = uVar7;
      do {
        uVar12 = SA[uVar34];
        iVar15 = ((int)uVar12 >> 1) + uVar33;
        uVar32 = SA[iVar15];
        if ((uVar32 == uVar28) && (uVar35 = (uint)uVar19, (int)(uVar32 + uVar35) < n)) {
          if ((int)uVar28 < 1) {
            uVar19 = 0;
LAB_001109b7:
            if ((uint)uVar19 != uVar28) goto LAB_001109c4;
          }
          else {
            uVar19 = 0;
            do {
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + uVar19 * 4 + (long)(int)uVar12 * 4);
                uVar38 = *(uint *)((long)T + uVar19 * 4 + (long)(int)uVar35 * 4);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + uVar19 + (long)(int)uVar12);
                uVar38 = (uint)*(byte *)((long)T + uVar19 + (long)(int)uVar35);
              }
              if (uVar36 != uVar38) goto LAB_001109b7;
              uVar19 = uVar19 + 1;
            } while (uVar28 != uVar19);
          }
        }
        else {
LAB_001109c4:
          iVar23 = iVar23 + 1;
          uVar35 = uVar12;
          uVar28 = uVar32;
        }
        SA[iVar15] = iVar23;
        uVar34 = uVar34 + 1;
        uVar19 = (ulong)uVar35;
      } while (uVar34 != local_e0);
      goto LAB_001109e5;
    }
    if ((bVar24 & 0x10) == 0) {
      puVar9 = __ptr + -(ulong)(uint)(k * 2);
LAB_0010ff3a:
      lVar37 = (uVar21 & 0xffffffff) + 1;
      if (n <= (int)lVar37) {
        __assert_fail("(j + 1) < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x272,
                      "int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
      }
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + (uVar21 & 0xffffffff) * 4 + 4);
      }
      else {
        uVar28 = (uint)*(byte *)((long)T + lVar37);
      }
      __ptr[(int)uVar28] = __ptr[(int)uVar28] + 1;
      uVar19 = 0;
      uVar28 = 0;
      do {
        uVar28 = uVar28 + __s[uVar19];
        uVar12 = __ptr[uVar19];
        if (uVar12 != uVar28) {
          if (SA[(int)uVar12] == 0) {
            __assert_fail("SA[B[i]] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x276,
                          "int sais_main(const void *, int *, int *, int, int, int, int, int, int)")
            ;
          }
          SA[(int)uVar12] = SA[(int)uVar12] + n;
        }
        puVar9[uVar4 + uVar19] = 0;
        puVar9[uVar19] = 0;
        uVar19 = uVar19 + 1;
      } while (uVar4 != uVar19);
      if (__s == __ptr) {
        __assert_fail("C != B",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0xa9,"void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                     );
      }
      uVar19 = 0;
      uVar28 = 0;
      do {
        uVar12 = __s[uVar19];
        __ptr[uVar19] = uVar28;
        uVar19 = uVar19 + 1;
        uVar28 = uVar12 + uVar28;
      } while (uVar4 != uVar19);
      if (cs == 4) {
        uVar28 = *(uint *)((long)T + uVar22 * 4);
        uVar19 = (ulong)(int)uVar28;
        uVar12 = *(uint *)((long)T + (ulong)(n - 2) * 4);
      }
      else {
        uVar19 = (ulong)*(byte *)((long)T + uVar22);
        uVar12 = (uint)*(byte *)((long)T + (ulong)(n - 2));
        uVar28 = (uint)*(byte *)((long)T + uVar22);
      }
      puVar31 = (uint *)(SA + (long)(int)__ptr[uVar19] + 1);
      puVar31[-1] = -(uint)((int)uVar12 < (int)uVar28) ^ n * 2 - 2U;
      uVar19 = 0;
      uVar12 = 0;
      do {
        uVar32 = SA[uVar19];
        if ((int)uVar32 < 1) {
          if ((int)uVar32 < 0) {
            uVar32 = ~uVar32;
            goto LAB_0011011d;
          }
        }
        else {
          iVar23 = 0;
          if (n <= (int)uVar32) {
            iVar23 = n;
          }
          lVar37 = (long)(int)(uVar32 - iVar23);
          if (cs == 4) {
            uVar35 = *(uint *)((long)T + lVar37 * 4);
            if ((int)uVar35 < *(int *)((long)T + lVar37 * 4 + 4)) {
LAB_001111ba:
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0xb6,
                            "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            uVar35 = (uint)*(byte *)((long)T + lVar37);
            if (*(byte *)((long)T + lVar37) < *(byte *)((long)T + lVar37 + 1)) goto LAB_001111ba;
          }
          if (uVar35 != uVar28) {
            __ptr[(int)uVar28] = (uint)((ulong)((long)puVar31 - (long)SA) >> 2);
            puVar31 = (uint *)(SA + (int)__ptr[(int)uVar35]);
            uVar28 = uVar35;
          }
          if ((long)puVar31 - (long)SA >> 2 <= (long)uVar19) {
            __assert_fail("i < (b - SA)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xb8,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar34 = lVar37 - 1;
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + lVar37 * 4 + -4);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + uVar34);
          }
          uVar12 = uVar12 + (n <= (int)uVar32);
          uVar32 = (uint)((int)uVar36 < (int)uVar28) | uVar35 * 2;
          if (puVar9[(int)uVar32] != uVar12) {
            uVar34 = (ulong)(uint)((int)uVar34 + n);
            puVar9[(int)uVar32] = uVar12;
          }
          *puVar31 = -(uint)((int)uVar36 < (int)uVar28) ^ (uint)uVar34;
          puVar31 = puVar31 + 1;
          uVar32 = 0;
LAB_0011011d:
          SA[uVar19] = uVar32;
        }
        uVar19 = uVar19 + 1;
        uVar34 = uVar22;
      } while (uVar5 != uVar19);
      do {
        uVar28 = (uint)uVar34;
        iVar23 = SA[uVar34];
        if (iVar23 < n && 0 < iVar23) {
          piVar8 = SA + uVar34;
          *piVar8 = iVar23 + n;
          do {
            piVar16 = piVar8 + -1;
            piVar8 = piVar8 + -1;
            uVar28 = (int)uVar34 - 1;
            uVar34 = (ulong)uVar28;
          } while (*piVar16 < n);
          *piVar8 = *piVar16 - n;
        }
        uVar34 = (ulong)(uVar28 - 1);
      } while (0 < (int)uVar28);
      uVar19 = 0;
      uVar28 = 0;
      do {
        uVar28 = uVar28 + __s[uVar19];
        __ptr[uVar19] = uVar28;
        uVar19 = uVar19 + 1;
      } while (uVar4 != uVar19);
      uVar12 = uVar12 + 1;
      piVar8 = SA + (int)*__ptr;
      uVar28 = 0;
      uVar19 = uVar22;
      do {
        iVar23 = SA[uVar19];
        if (0 < iVar23) {
          iVar15 = 0;
          if (n <= iVar23) {
            iVar15 = n;
          }
          lVar37 = (long)(iVar23 - iVar15);
          if (cs == 4) {
            uVar32 = *(uint *)((long)T + lVar37 * 4);
            if (*(int *)((long)T + lVar37 * 4 + 4) < (int)uVar32) {
LAB_001111f8:
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0xd2,
                            "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            uVar32 = (uint)*(byte *)((long)T + lVar37);
            if (*(byte *)((long)T + lVar37 + 1) < *(byte *)((long)T + lVar37)) goto LAB_001111f8;
          }
          if (uVar32 != uVar28) {
            __ptr[(int)uVar28] = (uint)((ulong)((long)piVar8 - (long)SA) >> 2);
            piVar8 = SA + (int)__ptr[(int)uVar32];
            uVar28 = uVar32;
          }
          if ((long)uVar19 < (long)piVar8 - (long)SA >> 2) {
            __assert_fail("(b - SA) <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xd4,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar34 = lVar37 - 1;
          if (cs == 4) {
            uVar35 = *(uint *)((long)T + lVar37 * 4 + -4);
          }
          else {
            uVar35 = (uint)*(byte *)((long)T + uVar34);
          }
          uVar12 = uVar12 + (n <= iVar23);
          uVar32 = (uint)((int)uVar28 < (int)uVar35) | uVar32 * 2;
          if (puVar9[(int)uVar32] != uVar12) {
            uVar34 = (ulong)(uint)((int)uVar34 + n);
            puVar9[(int)uVar32] = uVar12;
          }
          iVar23 = -2 - (int)uVar34;
          if ((int)uVar35 <= (int)uVar28) {
            iVar23 = (int)uVar34;
          }
          piVar8[-1] = iVar23;
          piVar8 = piVar8 + -1;
          SA[uVar19] = 0;
        }
        bVar40 = 0 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar40);
      iVar23 = 0;
      uVar19 = 1;
      while (SA[uVar19 - 1] < 0) {
        uVar28 = ~SA[uVar19 - 1];
        iVar23 = iVar23 + (uint)(n <= (int)uVar28);
        SA[uVar19 - 1] = uVar28;
        bVar40 = uVar19 == uVar5;
        uVar19 = uVar19 + 1;
        if (bVar40) {
          __assert_fail("(i + 1) < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0xe8,"int LMSpostproc2(int *, int, int)");
        }
      }
      uVar34 = uVar19 - 1;
      if ((int)uVar34 < (int)uVar33) {
        if ((int)uVar19 < n) {
          do {
            if (SA[uVar19] < 0) {
              uVar12 = ~SA[uVar19];
              iVar23 = iVar23 + (uint)(n <= (int)uVar12);
              iVar15 = (int)uVar34;
              uVar28 = iVar15 + 1;
              uVar34 = (ulong)uVar28;
              SA[iVar15] = uVar12;
              SA[uVar19] = 0;
              if (uVar28 == uVar33) goto LAB_00110369;
            }
            uVar19 = uVar19 + 1;
          } while (uVar5 != uVar19);
        }
        __assert_fail("i < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0xec,"int LMSpostproc2(int *, int, int)");
      }
LAB_00110369:
      if (iVar23 < (int)uVar33) {
        iVar15 = iVar23 + 1;
        uVar19 = local_e0 + 1;
        do {
          iVar39 = SA[uVar19 - 2];
          iVar29 = 0;
          if (n <= iVar39) {
            iVar29 = n;
          }
          iVar15 = iVar15 - (uint)(n <= iVar39);
          SA[(int)((iVar39 - iVar29 >> 1) + uVar33)] = iVar15;
          uVar19 = uVar19 - 1;
        } while (1 < uVar19);
      }
      else {
        uVar19 = 0;
        do {
          if (n <= SA[uVar19]) {
            SA[uVar19] = SA[uVar19] - n;
          }
          uVar19 = uVar19 + 1;
        } while (local_e0 != uVar19);
      }
      if ((bVar24 & 0x10) != 0) {
        free(puVar9);
      }
      goto LAB_001109e5;
    }
    puVar9 = (uint *)malloc((ulong)(uint)(k * 2) * 4);
    if (puVar9 != (uint *)0x0) goto LAB_0010ff3a;
    if ((bVar24 & 5) != 0) {
      free(__s);
    }
    iVar23 = -2;
LAB_001105cb:
    bVar24 = bVar24 & 2;
    __s = __ptr;
  }
  if (bVar24 == 0) {
    return iVar23;
  }
LAB_001105d7:
  free(__s);
  return iVar23;
}

Assistant:

static sais_index_type sais_main(const void *T, sais_index_type *SA,
				 sais_index_type *LCP,
				 sais_index_type fs, sais_index_type n, sais_index_type k, int cs,
				 sais_bool_type isbwt,
				 sais_bool_type level0) { /* level0 = 1 iff recursion depth is 0 */
  sais_index_type *C, *B, *D, *RA, *PLCP, *PHI, *DELTA, *b;
  sais_index_type i, j, m, /* m: number of S*-suffixes */
    p, q, t, name, pidx = 0, newfs;
  sais_index_type c0, c1;
  unsigned int flags;

  assert((T != NULL) && (SA != NULL));
  assert((0 <= fs) && (0 < n) && (1 <= k));

  if(k <= MINBUCKETSIZE) {
    if((C = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    if(k <= fs) {
      B = SA + (n + fs - k);
      flags = 1;
    } else {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { SAIS_MYFREE(C, k, sais_index_type); return -2; }
      flags = 3;
    }
  } else if(k <= fs) {
    C = SA + (n + fs - k);
    if(k <= (fs - k)) {
      B = C - k;
      flags = 0;
    } else if(k <= (MINBUCKETSIZE * 4)) {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
      flags = 2;
    } else {
      B = C;
      flags = 8;
    }
  } else {
    if((C = B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    flags = 4 | 8;
  }
  if((n <= SAIS_LMSSORT2_LIMIT) && (2 <= (n / k))) {
    if(flags & 1) { flags |= ((k * 2) <= (fs - k)) ? 32 : 16; }
    else if((flags == 0) && ((k * 2) <= (fs - k * 2))) { flags |= 32; }
  }

  /* stage 1: reduce the problem by at least 1/2
     sort all the LMS-substrings */
  getCounts(T, C, n, k, cs); getBuckets(C, B, k, 1); /* find ends of buckets */

  for(i = 0; i < n; ++i) { SA[i] = 0; }
  b = &t; i = n - 1; j = n; m = 0; c0 = chr(n - 1);
  do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
  for(; 0 <= i;) {
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
    if(0 <= i) {
      *b = j;
      b = SA + --B[c1]; j = i; ++m;
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    }
  }

  if(1 < m) {
    if(flags & (16 | 32)) {
      if(flags & 16) {
        if((D = SAIS_MYMALLOC(k * 2, sais_index_type)) == NULL) {
          if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
          if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
          return -2;
        }
      } else {
        D = B - k * 2;
      }
      assert((j + 1) < n);
      ++B[chr(j + 1)];
      for(i = 0, j = 0; i < k; ++i) {
        j += C[i];
        if(B[i] != j) { assert(SA[B[i]] != 0); SA[B[i]] += n; }
        D[i] = D[i + k] = 0;
      }
      LMSsort2(T, SA, C, B, D, n, k, cs);
      name = LMSpostproc2(SA, n, m);
      if(flags & 16) { SAIS_MYFREE(D, k * 2, sais_index_type); }
    } else {
      LMSsort1(T, SA, C, B, n, k, cs);
      name = LMSpostproc1(T, SA, n, m, cs);
    }
  } else if (m == 1) { /* only one S*-suffix => set immediately */
    *b = j + 1;        /* set entry in SA */
    if (level0) { LCP[b-SA] = -1; } /* mark first (=only) S*-suffix in bucket */
    name = 1;
  } else {
    name = 0;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    if(flags & 4) { SAIS_MYFREE(C, k, sais_index_type); }
    if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
    newfs = (n + fs) - (m * 2);
    if((flags & (1 | 4 | 8)) == 0) {
      if((k + name) <= newfs) { newfs -= k; }
      else { flags |= 8; }
    }
    assert((n >> 1) <= (newfs + m));
    RA = SA + m + newfs;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) {
        RA[j--] = SA[i] - 1;
      }
    }
    
    if(sais_main(RA, SA, NULL, newfs, m, name, sizeof(sais_index_type), 0, 0) != 0) {
      if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
      return -2;
    }

    /* (re)compute starting positions of S*-suffixes (stored in RA): */
    i = n - 1; j = m - 1; c0 = chr(n - 1);
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    for(; 0 <= i;) {
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
      if(0 <= i) {
        RA[j--] = i + 1;
        do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
      }
    }

    /* construct LCP for S*-suffixes: */
    /* PHI: "to whom I want to be compared" (pos. in T) */
    /* DELTA: "distance (in T) to next S*" (in PHI-order) */
    if (level0) {
      if (m < n/3) { /* hence we can store PHI and DELTA interleaved */
	PHI = LCP+m;       /* use space in LCP-array for PHI and DELTA */
	RA[m] = n;         /* stopper */
	j = SA[0];         /* j stores SA[i-1] in the following loop */
	PHI[j<<1] = n-1;   /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	PHI[(j<<1)+1] = 0; /* set DELTA */
	for (i = 1; i < m; ++i) {
	  q = SA[i];                /* text position */
	  p = q<<1;                 /* for interleaving */
	  PHI[p]=RA[j];             /* set PHI-array */
	  PHI[p+1]=RA[j+1]-RA[j];   /* set DELTA */
	  j = q;                    /* store for next loop iteration */
	}

	PLCP = PHI; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    sais_index_type twoj = j << 1;
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[twoj]+p)) ++p;
	    t = PHI[twoj+1];      /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[twoj] = p;       /* overwrite PHI with PLCP */
	    ++j;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]<<1];
      }
      else { /* non-interleaved */
	PHI = LCP;     /* use space in LCP-array for PHI */
	DELTA = LCP+m; /* because we compute only m < n/2 values, this is valid */
	RA[m] = n;     /* stopper */
	j = SA[0];     /* j stores SA[i-1] in the following loop */
	PHI[j] = n-1;  /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	DELTA[j] = 0;
	for (i = 1; i < m; ++i) {
	  q = SA[i];              /* text position */
	  PHI[q]=RA[j];           /* set PHI-array */
	  DELTA[q]=RA[j+1]-RA[j]; /* set DELTA */
	  j = q;                  /* store for next loop iteration */
	}

	PLCP = DELTA; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[j]+p)) ++p;
	    t = PLCP[j];          /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[j++] = p;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]];
      }
    }

    /* translate indices in RA to indices in T: */
    for(i = 0; i < m; ++i) SA[i] = RA[SA[i]];

    if(flags & 4) {
      if((C = B = SAIS_MYMALLOC(k, int)) == NULL) { return -2; }
    }
    if(flags & 2) {
      if((B = SAIS_MYMALLOC(k, int)) == NULL) {
        if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
        return -2;
      }
    }
  } /* endif (name < m) */
  else if (level0) { /* this should only occur for small or pathetic inputs */
    /* all names unique => computing LCP for *S naively takes linear time */
    /*printf("*** computing LCP naively..."); */
    j = SA[0]; /* j = SA[i-1] in the following loop */
    for (i = 1; i < m; ++i) {
      p = 0;
      while (chr(SA[i]+p) == chr(j+p)) p++;
      LCP[i] = p;
      j = SA[i];
    }
    /*printf("done.\n"); */
  }

  /* stage 3: induce the result for the original problem */
  if(flags & 8) { getCounts(T, C, n, k, cs); }
  /* put all S*-suffixes (and their LCP-values) into their buckets */
  if(1 < m) { /* otherwise SA (and LCP) is already correct */
    getBuckets(C, B, k, 1); /* find ends of buckets */
    i = m - 1, j = n, p = SA[m - 1], c1 = chr(p);
    if (level0) {
      newfs = LCP[m-1]; /* newfs stores LCP[i] in the following loop */
      do {
	q = B[c0 = c1];
	while(q < j) {
	  SA[--j] = 0; LCP[j] = -2; /* set remaining entries in old bucket to 0/-2 */
	}
	
	do { /* step through bucket c0 and write S*-suffixes to SA: */
	  SA[--j] = p; LCP[j] = newfs;
	  if(--i < 0) break;
	  newfs = LCP[i]; p = SA[i];
	} while((c1 = chr(p)) == c0);
	/*assert(LCP[j]==0); *//* first S*-suffix in bucket must have LCP-value 0 */
	LCP[j] = -1;       /* mark first S*-suffix in every bucket */
      } while(0 <= i);
      while(0 < j) {
	SA[--j] = 0; LCP[j] = -2; /* set remaining entries in smallest buckets to 0/-2 */
      }
    }
    else {
      do {
	q = B[c0 = c1];
	while(q < j) SA[--j] = 0; /* set remaining entries in old bucket to 0 */
	do { /* step through bucket c0 */
	  SA[--j] = p;
	  if(--i < 0) break;
	  p = SA[i];
	} while((c1 = chr(p)) == c0);
      } while(0 <= i);
      while(0 < j) SA[--j] = 0; /* set remaining entries in 1st bucket to 0 */
    }
  }

  if(isbwt == 0) {
    if (level0) induceSAandLCP(T, SA, LCP, C, B, n, k, cs);
    else induceSA(T, SA, C, B, n, k, cs);
  }
  else { pidx = computeBWT(T, SA, C, B, n, k, cs); }
  if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
  if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }

  return pidx;
}